

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConnection.cxx
# Opt level: O3

void __thiscall cmEventBasedConnection::WriteData(cmEventBasedConnection *this,string *_data)

{
  cmServerBase *pcVar1;
  pointer pcVar2;
  cmConnectionBufferStrategy *pcVar3;
  int iVar4;
  uv_write_t *req;
  char *base;
  uv_buf_t uVar5;
  string data;
  uv_thread_t curr_thread_id;
  long *local_70;
  ulong local_68;
  long local_60 [2];
  uv_thread_t local_50;
  long *local_48 [2];
  long local_38 [2];
  
  local_50 = uv_thread_self();
  pcVar1 = (this->super_cmConnection).Server;
  if (pcVar1 == (cmServerBase *)0x0) {
    __assert_fail("this->Server",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmConnection.cxx"
                  ,0x4a,"virtual void cmEventBasedConnection::WriteData(const std::string &)");
  }
  iVar4 = uv_thread_equal(&local_50,&pcVar1->ServeThreadId);
  if (iVar4 != 0) {
    pcVar2 = (_data->_M_dataplus)._M_p;
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + _data->_M_string_length);
    if (this->WriteStream != (uv_stream_t *)0x0) {
      pcVar3 = (this->BufferStrategy)._M_t.
               super___uniq_ptr_impl<cmConnectionBufferStrategy,_std::default_delete<cmConnectionBufferStrategy>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmConnectionBufferStrategy_*,_std::default_delete<cmConnectionBufferStrategy>_>
               .super__Head_base<0UL,_cmConnectionBufferStrategy_*,_false>._M_head_impl;
      if (pcVar3 != (cmConnectionBufferStrategy *)0x0) {
        (*pcVar3->_vptr_cmConnectionBufferStrategy[3])(local_48,pcVar3,&local_70);
        std::__cxx11::string::operator=((string *)&local_70,(string *)local_48);
        if (local_48[0] != local_38) {
          operator_delete(local_48[0],local_38[0] + 1);
        }
      }
      req = (uv_write_t *)operator_new(0xd0);
      req->data = this;
      base = (char *)operator_new__(local_68);
      uVar5 = uv_buf_init(base,(uint)local_68);
      *(uv_buf_t *)(req + 1) = uVar5;
      memcpy(uVar5.base,local_70,local_68);
      uv_write(req,this->WriteStream,(uv_buf_t *)(req + 1),1,on_write);
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
      return;
    }
    __assert_fail("this->WriteStream",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmConnection.cxx"
                  ,0x4f,"virtual void cmEventBasedConnection::WriteData(const std::string &)");
  }
  __assert_fail("uv_thread_equal(&curr_thread_id, &this->Server->ServeThreadId)",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmConnection.cxx"
                ,0x4b,"virtual void cmEventBasedConnection::WriteData(const std::string &)");
}

Assistant:

void cmEventBasedConnection::WriteData(const std::string& _data)
{
#ifndef NDEBUG
  auto curr_thread_id = uv_thread_self();
  assert(this->Server);
  assert(uv_thread_equal(&curr_thread_id, &this->Server->ServeThreadId));
#endif

  auto data = _data;
  assert(this->WriteStream);
  if (BufferStrategy) {
    data = BufferStrategy->BufferOutMessage(data);
  }

  auto ds = data.size();

  write_req_t* req = new write_req_t;
  req->req.data = this;
  req->buf = uv_buf_init(new char[ds], static_cast<unsigned int>(ds));
  memcpy(req->buf.base, data.c_str(), ds);
  uv_write(reinterpret_cast<uv_write_t*>(req),
           static_cast<uv_stream_t*>(this->WriteStream), &req->buf, 1,
           on_write);
}